

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Oscs.cpp
# Opt level: O2

void __thiscall Gb_Square::run(Gb_Square *this,blip_time_t time,blip_time_t end_time,int playing)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  Blip_Buffer *buf;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int delta;
  
  uVar8 = 0;
  if (this->sweep_freq != 0x800) {
    uVar8 = playing;
  }
  puVar4 = (this->super_Gb_Env).super_Gb_Osc.regs;
  bVar1 = "\x01\x02\x04\x06"[puVar4[1] >> 6];
  uVar3 = (this->super_Gb_Env).super_Gb_Osc.volume;
  uVar6 = uVar3 & uVar8;
  uVar5 = -uVar6;
  if (this->phase < (int)(uint)bVar1) {
    uVar5 = uVar6;
  }
  uVar9 = (puVar4[4] & 7) * 0x100;
  bVar2 = puVar4[3];
  uVar6 = (bVar2 + uVar9) - 0x7fa;
  uVar3 = (int)uVar3 >> 1;
  if (0xfffff806 < uVar6) {
    uVar3 = uVar5;
  }
  iVar7 = uVar3 - (this->super_Gb_Env).super_Gb_Osc.last_amp;
  if (iVar7 != 0) {
    (this->super_Gb_Env).super_Gb_Osc.last_amp = uVar3;
    Blip_Synth<12,_1>::offset(this->synth,time,iVar7,(this->super_Gb_Env).super_Gb_Osc.output);
  }
  iVar7 = time + (this->super_Gb_Env).super_Gb_Osc.delay;
  if (uVar8 == 0) {
    iVar7 = end_time;
  }
  if (uVar6 < 0xfffff807) {
    iVar7 = end_time;
  }
  if (iVar7 < end_time) {
    buf = (this->super_Gb_Env).super_Gb_Osc.output;
    uVar8 = this->phase;
    delta = uVar3 * 2;
    do {
      uVar8 = uVar8 + 1 & 7;
      if ((uVar8 == 0) || (uVar8 == bVar1)) {
        delta = -delta;
        Blip_Synth<12,_1>::offset_inline(this->synth,iVar7,delta,buf);
      }
      iVar7 = iVar7 + (uVar9 | bVar2) * -4 + 0x2000;
    } while (iVar7 < end_time);
    this->phase = uVar8;
    (this->super_Gb_Env).super_Gb_Osc.last_amp = delta >> 1;
  }
  (this->super_Gb_Env).super_Gb_Osc.delay = iVar7 - end_time;
  return;
}

Assistant:

void Gb_Square::run( blip_time_t time, blip_time_t end_time, int playing )
{
	if ( sweep_freq == 2048 )
		playing = false;
	
	static unsigned char const table [4] = { 1, 2, 4, 6 };
	int const duty = table [regs [1] >> 6];
	int amp = volume & playing;
	if ( phase >= duty )
		amp = -amp;
	
	int frequency = this->frequency();
	if ( unsigned (frequency - 1) > 2040 ) // frequency < 1 || frequency > 2041
	{
		// really high frequency results in DC at half volume
		amp = volume >> 1;
		playing = false;
	}
	
	{
		int delta = amp - last_amp;
		if ( delta )
		{
			last_amp = amp;
			synth->offset( time, delta, output );
		}
	}
	
	time += delay;
	if ( !playing )
		time = end_time;
	
	if ( time < end_time )
	{
		int const period = (2048 - frequency) * 4;
		Blip_Buffer* const output = this->output;
		int phase = this->phase;
		int delta = amp * 2;
		do
		{
			phase = (phase + 1) & 7;
			if ( phase == 0 || phase == duty )
			{
				delta = -delta;
				synth->offset_inline( time, delta, output );
			}
			time += period;
		}
		while ( time < end_time );
		
		this->phase = phase;
		last_amp = delta >> 1;
	}
	delay = time - end_time;
}